

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Method_dispatcher_manager::enable_introspection(Method_dispatcher_manager *this)

{
  Default_method_dispatcher *pDVar1;
  mapped_type pMVar2;
  mapped_type *ppMVar3;
  key_type local_40;
  
  pDVar1 = this->impl_->default_disp;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"system.listMethods","");
  pMVar2 = (mapped_type)operator_new(0x10);
  pMVar2->_vptr_Method_factory_base = (_func_int **)&PTR__Method_factory_base_001884a8;
  pMVar2[1]._vptr_Method_factory_base = (_func_int **)this;
  ppMVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Method_factory_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Method_factory_base_*>_>_>
            ::operator[](&pDVar1->fs,&local_40);
  *ppMVar3 = pMVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Method_dispatcher_manager::enable_introspection()
{
  impl_->default_disp->register_method("system.listMethods",
    new System_method_factory<builtins::List_methods>(this));
}